

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

void create_cb(uv_fs_t *req)

{
  uv_buf_t uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  uv_buf_t iov;
  int64_t eval_b_3;
  uv_metrics_t metrics;
  
  uVar3 = uv_default_loop();
  iVar2 = uv_metrics_info(uVar3,&metrics);
  pcVar4 = (char *)(long)iVar2;
  uVar1.len = iov.len;
  uVar1.base = pcVar4;
  eval_b = 0;
  if (pcVar4 == (char *)0x0) {
    iov.base = (char *)0x1;
    uVar1.base = (char *)0x1;
    if (metrics.loop_count == 1) {
      iov.base = (char *)req->result;
      uVar1.base = iov.base;
      eval_b = 0;
      if ((long)iov.base < 0) {
        pcVar7 = ">=";
        pcVar6 = "0";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar5 = "req->result";
        uVar3 = 0xc0;
        pcVar4 = iov.base;
      }
      else {
        uv_fs_req_cleanup(req);
        last_events_count = metrics.events;
        iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
        uVar3 = uv_default_loop();
        iVar2 = uv_fs_write(uVar3,0x305ce0,(int)req->result,&iov,1,0,write_cb);
        if ((char *)(long)iVar2 == (char *)0x0) {
          return;
        }
        pcVar6 = "0";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar5 = 
        "uv_fs_write(uv_default_loop(), &fs_reqs.write_req, (uv_os_fd_t) req->result, &iov, 1, 0, write_cb)"
        ;
        uVar3 = 0xcc;
        eval_b = 0;
        pcVar7 = "==";
        pcVar4 = (char *)(long)iVar2;
        uVar1 = iov;
      }
    }
    else {
      pcVar7 = "==";
      pcVar6 = "metrics.loop_count";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n";
      pcVar5 = "1";
      uVar3 = 0xbf;
      pcVar4 = iov.base;
      eval_b = metrics.loop_count;
    }
  }
  else {
    pcVar7 = "==";
    pcVar6 = "0";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar5 = "uv_metrics_info(uv_default_loop(), &metrics)";
    uVar3 = 0xbd;
  }
  iov = uVar1;
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
          ,uVar3,pcVar5,pcVar7,pcVar6,pcVar4,pcVar7,eval_b);
  abort();
}

Assistant:

static void create_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* Event count here is still 0 so not going to check. */
  ASSERT_UINT64_EQ(1, metrics.loop_count);
  ASSERT_GE(req->result, 0);

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  uv_buf_t iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &fs_reqs.write_req,
                        (uv_os_fd_t) req->result,
                        &iov,
                        1,
                        0,
                        write_cb));
}